

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

string * __thiscall
pbrt::SpectrumHandle::ParameterString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumHandle *this)

{
  uint uVar1;
  RGBSpectrum *this_00;
  DenselySampledSpectrum *this_01;
  
  this_01 = (DenselySampledSpectrum *)
            (this->
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
            ).bits;
  uVar1 = (uint)(ushort)((ulong)this_01 >> 0x30);
  if ((ulong)this_01 >> 0x32 != 0) {
    uVar1 = uVar1 - 3;
    this_00 = (RGBSpectrum *)((ulong)this_01 & 0xffffffffffff);
    if (uVar1 < 2) {
      RGBSpectrum::ParameterString_abi_cxx11_(__return_storage_ptr__,this_00);
    }
    else if (uVar1 == 2) {
      RGBReflectanceSpectrum::ParameterString_abi_cxx11_
                (__return_storage_ptr__,(RGBReflectanceSpectrum *)this_00);
    }
    else {
      BlackbodySpectrum::ParameterString_abi_cxx11_
                (__return_storage_ptr__,(BlackbodySpectrum *)this_00);
    }
    return __return_storage_ptr__;
  }
  if ((ulong)this_01 >> 0x31 == 0) {
    ConstantSpectrum::ParameterString_abi_cxx11_(__return_storage_ptr__,(ConstantSpectrum *)this_01)
    ;
  }
  else if (uVar1 != 2) {
    PiecewiseLinearSpectrum::ParameterString_abi_cxx11_
              (__return_storage_ptr__,(PiecewiseLinearSpectrum *)((ulong)this_01 & 0xffffffffffff));
    return __return_storage_ptr__;
  }
  DenselySampledSpectrum::ParameterString_abi_cxx11_(__return_storage_ptr__,this_01);
}

Assistant:

std::string SpectrumHandle::ParameterString() const {
    auto ps = [&](auto ptr) { return ptr->ParameterString(); };
    return DispatchCPU(ps);
}